

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::unique_array<mpt::item<mpt::layout::graph::data>_>::reserve
          (unique_array<mpt::item<mpt::layout::graph::data>_> *this,long len)

{
  int iVar1;
  content<mpt::item<mpt::layout::graph::data>_> *ref;
  long lVar2;
  undefined4 extraout_var;
  content<mpt::item<mpt::layout::graph::data>_> *n;
  content<mpt::item<mpt::layout::graph::data>_> *c;
  long len_local;
  unique_array<mpt::item<mpt::layout::graph::data>_> *this_local;
  
  ref = reference<mpt::content<mpt::item<mpt::layout::graph::data>_>_>::detach(&this->_ref);
  if (ref == (content<mpt::item<mpt::layout::graph::data>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    c = (content<mpt::item<mpt::layout::graph::data>_> *)len;
    if (len < 0) {
      lVar2 = length(this);
      c = (content<mpt::item<mpt::layout::graph::data>_> *)(lVar2 + len);
      if ((long)c < 0) {
        reference<mpt::content<mpt::item<mpt::layout::graph::data>_>_>::set_instance
                  (&this->_ref,ref);
        return false;
      }
    }
    iVar1 = (*(ref->super_buffer)._vptr_buffer[3])(ref,(long)c << 5);
    if ((content<mpt::item<mpt::layout::graph::data>_> *)CONCAT44(extraout_var,iVar1) ==
        (content<mpt::item<mpt::layout::graph::data>_> *)0x0) {
      reference<mpt::content<mpt::item<mpt::layout::graph::data>_>_>::set_instance(&this->_ref,ref);
      this_local._7_1_ = true;
    }
    else {
      reference<mpt::content<mpt::item<mpt::layout::graph::data>_>_>::set_instance
                (&this->_ref,
                 (content<mpt::item<mpt::layout::graph::data>_> *)CONCAT44(extraout_var,iVar1));
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool reserve(long len)
	{
		content<T> *c;
		if (!(c = _ref.detach())) {
			return false;
		}
		if (len < 0
		    && (len += length()) < 0) {
			_ref.set_instance(c);
			return false;
		}
		content<T> *n;
		if ((n = c->detach(len * sizeof(T)))) {
			_ref.set_instance(n);
			return true;
		}
		_ref.set_instance(c);
		return true;
	}